

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O3

ostream * pstack::Procman::operator<<(ostream *os,UnwindMechanism mech)

{
  long lVar1;
  char *pcVar2;
  
  switch(mech) {
  case MACHINEREGS:
    pcVar2 = "machine registers";
    goto LAB_00126d8e;
  case DWARF:
    pcVar2 = "DWARF";
    lVar1 = 5;
    break;
  case FRAMEPOINTER:
    pcVar2 = "frame pointer";
    lVar1 = 0xd;
    break;
  case BAD_IP_RECOVERY:
    pcVar2 = "popped faulting IP";
    lVar1 = 0x12;
    break;
  case TRAMPOLINE:
    pcVar2 = "signal trampoline";
LAB_00126d8e:
    lVar1 = 0x11;
    break;
  case LOGFILE:
    pcVar2 = "log file";
    lVar1 = 8;
    break;
  case INVALID:
    pcVar2 = "invalid";
    lVar1 = 7;
    break;
  default:
    abort();
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return os;
}

Assistant:

std::ostream &operator << (std::ostream &os, UnwindMechanism mech) {
   switch (mech) {
      case UnwindMechanism::MACHINEREGS: return os << "machine registers";
      case UnwindMechanism::DWARF: return os << "DWARF";
      case UnwindMechanism::FRAMEPOINTER: return os << "frame pointer";
      case UnwindMechanism::BAD_IP_RECOVERY: return os << "popped faulting IP";
      case UnwindMechanism::TRAMPOLINE: return os << "signal trampoline";
      case UnwindMechanism::LOGFILE: return os << "log file";
      case UnwindMechanism::INVALID: return os << "invalid";
   }
   abort();
}